

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  uudecode *puVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  byte *b;
  size_t size;
  uint uVar5;
  long lVar6;
  char *fmt;
  long lVar7;
  long lVar8;
  byte bVar9;
  byte *pbVar10;
  byte *pbVar11;
  archive_read *a;
  ulong uVar12;
  ulong uVar13;
  ssize_t sVar14;
  byte *pbVar15;
  ssize_t avail_in;
  uudecode *local_58;
  ssize_t local_50;
  void **local_48;
  long local_40;
  ssize_t nl;
  
  local_58 = (uudecode *)self->data;
  local_48 = buff;
LAB_0011adf7:
  puVar1 = local_58;
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,&avail_in);
  if (b == (byte *)0x0 && avail_in < 0) {
    return -0x1e;
  }
  if (b == (byte *)0x0) {
    avail_in = 0;
  }
  local_50 = avail_in;
  if (puVar1->state != 4) {
    pbVar15 = puVar1->out_buff;
    if ((long)puVar1->in_cnt != 0) {
      iVar3 = ensure_in_buff_size(self,puVar1,puVar1->in_cnt + avail_in);
      if (iVar3 != 0) {
        return -0x1e;
      }
      memcpy(puVar1->in_buff + puVar1->in_cnt,b,avail_in);
      b = puVar1->in_buff;
      avail_in = puVar1->in_cnt + avail_in;
      puVar1->in_cnt = 0;
    }
    lVar7 = 0;
    lVar8 = 0;
    do {
      sVar14 = avail_in;
      if (avail_in - lVar7 == 0 || avail_in < lVar7) goto LAB_0011b357;
      size = get_line(b,avail_in - lVar7,&nl);
      puVar1 = local_58;
      if ((long)size < 0) {
        if ((local_58->state != 0) || ((local_58->total < 1 && (lVar8 < 1)))) {
LAB_0011b312:
          a = self->archive;
          fmt = "Insufficient compressed data";
          iVar3 = -1;
LAB_0011b323:
          archive_set_error(&a->archive,iVar3,fmt);
          return -0x1e;
        }
        local_58->state = 4;
        lVar7 = sVar14;
        goto LAB_0011b357;
      }
      if (nl == 0) goto LAB_0011b296;
      iVar3 = local_58->state;
      lVar6 = size * 2 + lVar8;
      local_40 = lVar7;
      if (iVar3 == 1) {
        if (lVar6 < 0x10001) {
          if ((""[*b] != '\0') && (0 < (long)(size - nl))) {
            uVar5 = *b & 0x3f;
            uVar12 = (ulong)uVar5 ^ 0x20;
            if (uVar12 < size - nl) {
              iVar3 = 2;
              if ((char)uVar5 != ' ') {
                lVar7 = lVar8;
                pbVar2 = b + 1;
                pbVar10 = pbVar15;
                while (pbVar15 = pbVar10, uVar13 = uVar12, pbVar11 = pbVar2, lVar8 = lVar7,
                      0 < (long)uVar13) {
                  if ((""[*pbVar11] == '\0') || (""[pbVar11[1]] == '\0')) goto LAB_0011b312;
                  iVar3 = (pbVar11[1] & 0x3f ^ 0x20) << 0xc;
                  *pbVar15 = (byte)(((*pbVar11 ^ 0x20) << 0x12) >> 0x10) |
                             (byte)((uint)iVar3 >> 0x10);
                  lVar7 = lVar8 + 1;
                  pbVar2 = pbVar11 + 2;
                  uVar12 = 0;
                  pbVar10 = pbVar15 + 1;
                  if (uVar13 != 1) {
                    bVar9 = pbVar11[2];
                    if (""[bVar9] == '\0') goto LAB_0011b312;
                    iVar4 = (bVar9 & 0x3f ^ 0x20) << 6;
                    pbVar15[1] = (byte)((uint)iVar3 >> 8) | (byte)((uint)iVar4 >> 8);
                    lVar7 = lVar8 + 2;
                    pbVar2 = pbVar11 + 3;
                    uVar12 = 0;
                    pbVar10 = pbVar15 + 2;
                    if (uVar13 != 2) {
                      bVar9 = pbVar11[3];
                      if (""[bVar9] == '\0') goto LAB_0011b312;
                      pbVar15[2] = ((byte)iVar4 | bVar9 & 0x3f) ^ 0x20;
                      lVar7 = lVar8 + 3;
                      pbVar2 = pbVar11 + 4;
                      uVar12 = uVar13 - 3;
                      pbVar10 = pbVar15 + 3;
                    }
                  }
                }
                goto LAB_0011b281;
              }
              goto LAB_0011b0af;
            }
          }
          goto LAB_0011b312;
        }
        goto LAB_0011b357;
      }
      if (iVar3 == 2) {
        if ((size - nl != 3) || (iVar3 = bcmp(b,"end ",3), iVar3 != 0)) goto LAB_0011b312;
LAB_0011b05b:
        iVar3 = 0;
LAB_0011b0af:
        local_58->state = iVar3;
      }
      else if (iVar3 == 3) {
        if (0x10000 < lVar6) goto LAB_0011b357;
        uVar12 = size - nl;
        pbVar2 = b;
        if (((2 < (long)uVar12) && (*b == 0x3d)) && ((b[1] == 0x3d && (b[2] == 0x3d))))
        goto LAB_0011b05b;
        while (pbVar11 = pbVar15, uVar13 = uVar12, pbVar10 = pbVar2, lVar7 = lVar8, lVar8 = lVar7,
              pbVar15 = pbVar11, 0 < (long)uVar13) {
          bVar9 = *pbVar10;
          if ((""[bVar9] == '\0') || (""[pbVar10[1]] == '\0')) goto LAB_0011b265;
          iVar3 = base64num[pbVar10[1]];
          *pbVar11 = (byte)((uint)(base64num[bVar9] << 0x12) >> 0x10) |
                     (byte)((uint)(iVar3 << 0xc) >> 0x10);
          lVar8 = lVar7 + 1;
          pbVar2 = pbVar10 + 2;
          uVar12 = uVar13 - 2;
          pbVar15 = pbVar11 + 1;
          if (2 < uVar13) {
            uVar12 = (ulong)pbVar10[2];
            if (uVar12 == 0x3d) goto LAB_0011b281;
            if (""[uVar12] == '\0') goto LAB_0011b312;
            iVar4 = base64num[uVar12];
            pbVar11[1] = (byte)((uint)(iVar3 << 0xc) >> 8) | (byte)((uint)(iVar4 << 6) >> 8);
            lVar8 = lVar7 + 2;
            pbVar2 = pbVar10 + 3;
            uVar12 = 0;
            pbVar15 = pbVar11 + 2;
            if (uVar13 != 3) {
              uVar12 = (ulong)pbVar10[3];
              if (uVar12 == 0x3d) goto LAB_0011b281;
              if (""[uVar12] == '\0') goto LAB_0011b312;
              pbVar11[2] = (byte)(iVar4 << 6) | (byte)base64num[uVar12];
              lVar8 = lVar7 + 3;
              pbVar2 = pbVar10 + 4;
              uVar12 = uVar13 - 4;
              pbVar15 = pbVar11 + 3;
            }
          }
        }
        if (uVar13 != 0) {
          bVar9 = *pbVar10;
LAB_0011b265:
          if (bVar9 != 0x3d) goto LAB_0011b312;
        }
      }
      else {
        if (0x1ffff < (long)(size + lVar8)) {
          a = self->archive;
          fmt = "Invalid format data";
          iVar3 = 0x54;
          goto LAB_0011b323;
        }
        uVar12 = size - nl;
        if (10 < (long)uVar12) {
          lVar7 = 6;
          iVar3 = bcmp(b,"begin ",6);
          if (iVar3 == 0) {
LAB_0011b129:
            if (((((b[lVar7] & 0xf8) == 0x30) && ((b[lVar7 + 1] & 0xf8) == 0x30)) &&
                ((b[lVar7 + 2] & 0xf8) == 0x30)) && (b[lVar7 + 3] == 0x20)) {
              iVar3 = (uint)(iVar3 != 0) * 2 + 1;
              goto LAB_0011b0af;
            }
          }
          else if (0x11 < uVar12) {
            lVar7 = 0xd;
            iVar4 = bcmp(b,"begin-base64 ",0xd);
            if (iVar4 == 0) goto LAB_0011b129;
          }
        }
      }
LAB_0011b281:
      b = b + size;
      lVar7 = local_40 + size;
    } while( true );
  }
  lVar8 = 0;
  lVar7 = avail_in;
  sVar14 = avail_in;
  goto LAB_0011b357;
LAB_0011b296:
  iVar3 = ensure_in_buff_size(self,local_58,size);
  if (iVar3 != 0) {
    return -0x1e;
  }
  if (puVar1->in_buff != b) {
    memmove(puVar1->in_buff,b,size);
  }
  local_58->in_cnt = (int)size;
  sVar14 = avail_in;
  if (lVar8 != 0) {
LAB_0011b357:
    lVar6 = 0;
    if (local_50 < sVar14) {
      lVar6 = local_50 - sVar14;
    }
    __archive_read_filter_consume(self->upstream,lVar6 + lVar7);
    *local_48 = local_58->out_buff;
    local_58->total = local_58->total + lVar8;
    return lVar8;
  }
  __archive_read_filter_consume(self->upstream,local_50);
  goto LAB_0011adf7;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		int64_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if (nl == 0) {
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = (int)len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of curent line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (l > 0) {
					if (!uuchar[b[0]] || !uuchar[b[1]])
						break;
					n = UUDECODE(*b++) << 18;
					n |= UUDECODE(*b++) << 12;
					*out++ = n >> 16; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (l > 0) {
					if (!base64[b[0]] || !base64[b[1]])
						break;
					n = base64num[*b++] << 18;
					n |= base64num[*b++] << 12;
					*out++ = n >> 16; total++;
					l -= 2;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}